

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O1

void __thiscall wallet::wallet_tests::ListCoinsTest::test_method(ListCoinsTest *this)

{
  long lVar1;
  _Base_ptr p_Var2;
  undefined1 auVar3 [16];
  CoinFilterParams params;
  CoinFilterParams params_00;
  CRecipient recipient;
  int iVar4;
  variant_alternative_t<2UL,_variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  *pvVar5;
  _Base_ptr p_Var6;
  CCoinControl *coinControl;
  long lVar7;
  COutput *coin;
  _Base_ptr p_Var8;
  iterator in_R8;
  iterator pvVar9;
  iterator in_R9;
  iterator pvVar10;
  long in_FS_OFFSET;
  bool bVar11;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  CoinFilterParams *in_stack_fffffffffffffc38;
  undefined8 in_stack_fffffffffffffc40;
  undefined8 in_stack_fffffffffffffc48;
  undefined8 in_stack_fffffffffffffc50;
  undefined8 in_stack_fffffffffffffc58;
  undefined8 in_stack_fffffffffffffc60;
  undefined8 in_stack_fffffffffffffc68;
  undefined8 in_stack_fffffffffffffc70;
  undefined8 in_stack_fffffffffffffc78;
  undefined8 in_stack_fffffffffffffc80;
  undefined8 in_stack_fffffffffffffc88;
  undefined8 in_stack_fffffffffffffc90;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  undefined4 local_33c;
  undefined1 local_338 [24];
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  undefined1 local_230 [8];
  lazy_ostream local_228;
  undefined1 *local_218;
  undefined8 local_210;
  string *local_208;
  undefined1 local_200 [16];
  assertion_result local_1f0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined2 local_1b8;
  undefined1 uStack_1b6;
  undefined5 uStack_1b5;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined2 local_190;
  undefined1 uStack_18e;
  undefined5 uStack_18d;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock55;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock52;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_150;
  undefined1 local_108;
  undefined8 local_100;
  undefined1 local_f8;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock53;
  undefined1 auStack_e0 [16];
  _Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  local_d0;
  string coinbaseAddress;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock56;
  _Base_ptr local_70;
  _Base_ptr local_68;
  _Base_ptr p_Stack_60;
  string *local_58;
  string *local_50;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CKey::GetPubKey((CPubKey *)&criticalblock56,
                  &(this->super_ListCoinsTestingSetup).super_TestChain100Setup.coinbaseKey);
  CPubKey::GetID((CKeyID *)(auStack_e0 + 0x10),(CPubKey *)&criticalblock56);
  base_blob<160u>::ToString_abi_cxx11_(&coinbaseAddress,(CKeyID *)(auStack_e0 + 0x10));
  local_d0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d0._M_impl.super__Rb_tree_header._M_header;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_color = 0;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d0._M_impl.super__Rb_tree_header._M_node_count = 0;
  criticalblock52.super_unique_lock._M_device =
       &(((this->super_ListCoinsTestingSetup).wallet._M_t.
          super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
          super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
          super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl)->cs_wallet).
        super_recursive_mutex;
  criticalblock52.super_unique_lock._8_8_ =
       criticalblock52.super_unique_lock._8_8_ & 0xffffffffffffff00;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d0._M_impl.super__Rb_tree_header._M_header._M_left;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock52.super_unique_lock);
  ListCoins((map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
             *)&criticalblock56,
            (this->super_ListCoinsTestingSetup).wallet._M_t.
            super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
            super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
            super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl);
  std::
  _Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  ::clear((_Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
           *)(auStack_e0 + 0x10));
  if (local_70 != (_Base_ptr)0x0) {
    local_d0._M_impl.super__Rb_tree_header._M_header._M_color =
         criticalblock56.super_unique_lock._8_4_;
    local_d0._M_impl.super__Rb_tree_header._M_header._M_parent = local_70;
    local_d0._M_impl.super__Rb_tree_header._M_header._M_left = local_68;
    local_d0._M_impl.super__Rb_tree_header._M_header._M_right = p_Stack_60;
    local_70->_M_parent = &local_d0._M_impl.super__Rb_tree_header._M_header;
    local_d0._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_58;
    local_58 = (string *)0x0;
    p_Stack_60 = (_Base_ptr)&criticalblock56.super_unique_lock._M_owns;
  }
  std::
  _Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
               *)&criticalblock56);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock52.super_unique_lock);
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x27a;
  file.m_begin = (iterator)&local_240;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_250,msg);
  local_228.m_empty = false;
  local_228._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_218 = boost::unit_test::lazy_ostream::inst;
  local_210 = "";
  local_200._0_8_ = &local_208;
  local_208 = (string *)local_d0._M_impl.super__Rb_tree_header._M_node_count;
  criticalblock55.super_unique_lock._M_device = (mutex_type *)local_230;
  criticalblock53.super_unique_lock._M_device =
       (mutex_type *)
       CONCAT71(criticalblock53.super_unique_lock._M_device._1_7_,
                (string *)local_d0._M_impl.super__Rb_tree_header._M_node_count == (string *)0x1);
  local_230._0_4_ = 1;
  criticalblock53.super_unique_lock._M_owns = false;
  criticalblock53.super_unique_lock._9_7_ = 0;
  auStack_e0._0_8_ = (sp_counted_base *)0x0;
  local_1f0._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_1f0.m_message.px = (element_type *)0xfb26f1;
  criticalblock56.super_unique_lock._8_4_ = criticalblock56.super_unique_lock._8_4_ & 0xffffff00;
  criticalblock56.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013d3cf0;
  criticalblock52.super_unique_lock._8_8_ =
       criticalblock52.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock52.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013d3d30;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock53,&local_228,1,2,REQUIRE,0xe84389,(size_t)&local_1f0
             ,0x27a,(_Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
                     *)&criticalblock56,"1U",&criticalblock52.super_unique_lock);
  boost::detail::shared_count::~shared_count((shared_count *)auStack_e0);
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x27b;
  file_00.m_begin = (iterator)&local_260;
  msg_00.m_end = pvVar10;
  msg_00.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_270,
             msg_00);
  local_228.m_empty = false;
  local_228._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_218 = boost::unit_test::lazy_ostream::inst;
  local_210 = "";
  pvVar5 = std::
           get<2ul,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                     ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)(local_d0._M_impl.super__Rb_tree_header._M_header._M_left + 1));
  base_blob<160u>::ToString_abi_cxx11_((string *)&criticalblock53,pvVar5);
  if (criticalblock53.super_unique_lock._8_8_ == coinbaseAddress._M_string_length) {
    if (criticalblock53.super_unique_lock._8_8_ == 0) {
      bVar11 = true;
    }
    else {
      iVar4 = bcmp(criticalblock53.super_unique_lock._M_device,coinbaseAddress._M_dataplus._M_p,
                   criticalblock53.super_unique_lock._8_8_);
      bVar11 = iVar4 == 0;
    }
  }
  else {
    bVar11 = false;
  }
  local_1f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar11;
  local_1f0.m_message.px = (element_type *)0x0;
  local_1f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_200._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_200._8_8_ = "";
  criticalblock56.super_unique_lock._8_4_ = criticalblock56.super_unique_lock._8_4_ & 0xffffff00;
  criticalblock56.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013d3d70;
  local_208 = &coinbaseAddress;
  criticalblock52.super_unique_lock._8_8_ =
       criticalblock52.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock52.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013d3d70;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  criticalblock55.super_unique_lock._M_device = (mutex_type *)&criticalblock53;
  boost::test_tools::tt_detail::report_assertion
            (&local_1f0,&local_228,1,2,REQUIRE,0xfb3093,(size_t)local_200,0x27b,
             (_Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
              *)&criticalblock56,"coinbaseAddress",&criticalblock52.super_unique_lock);
  boost::detail::shared_count::~shared_count(&local_1f0.m_message.pn);
  if (criticalblock53.super_unique_lock._M_device != (mutex_type *)auStack_e0) {
    operator_delete(criticalblock53.super_unique_lock._M_device,(ulong)(auStack_e0._0_8_ + 1));
  }
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x27c;
  file_01.m_begin = (iterator)&local_280;
  msg_01.m_end = pvVar10;
  msg_01.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_290,
             msg_01);
  local_228.m_empty = false;
  local_228._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_218 = boost::unit_test::lazy_ostream::inst;
  local_210 = "";
  lVar7 = (long)local_d0._M_impl.super__Rb_tree_header._M_header._M_left[3]._M_right -
          (long)local_d0._M_impl.super__Rb_tree_header._M_header._M_left[3]._M_left;
  local_208 = (string *)((lVar7 >> 5) * -0x3333333333333333);
  criticalblock53.super_unique_lock._M_device =
       (mutex_type *)CONCAT71(criticalblock53.super_unique_lock._M_device._1_7_,lVar7 == 0xa0);
  local_230._0_4_ = 1;
  criticalblock53.super_unique_lock._M_owns = false;
  criticalblock53.super_unique_lock._9_7_ = 0;
  auStack_e0._0_8_ = (sp_counted_base *)0x0;
  criticalblock56.super_unique_lock._8_4_ = criticalblock56.super_unique_lock._8_4_ & 0xffffff00;
  criticalblock52.super_unique_lock._8_8_ =
       criticalblock52.super_unique_lock._8_8_ & 0xffffffffffffff00;
  local_1f0._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_1f0.m_message.px = (element_type *)0xfb26f1;
  local_200._0_8_ = &local_208;
  criticalblock56.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013d3cf0;
  criticalblock55.super_unique_lock._M_device = (mutex_type *)local_230;
  criticalblock52.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013d3d30;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock53,&local_228,1,2,REQUIRE,0xfb30d4,(size_t)&local_1f0
             ,0x27c,(_Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
                     *)&criticalblock56,"1U",&criticalblock52.super_unique_lock);
  boost::detail::shared_count::~shared_count((shared_count *)auStack_e0);
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_298 = "";
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x27f;
  file_02.m_begin = (iterator)&local_2a0;
  msg_02.m_end = pvVar10;
  msg_02.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2b0,
             msg_02);
  local_228.m_empty = false;
  local_228._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_218 = boost::unit_test::lazy_ostream::inst;
  local_210 = "";
  local_208 = (string *)0x12a05f200;
  coinControl = (CCoinControl *)
                &((this->super_ListCoinsTestingSetup).wallet._M_t.
                  super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t
                  .super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
                  super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl)->cs_wallet;
  criticalblock53.super_unique_lock._8_8_ =
       criticalblock53.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock53.super_unique_lock._M_device = (mutex_type *)coinControl;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock53.super_unique_lock);
  criticalblock52.super_unique_lock._M_device = (mutex_type *)0x1;
  criticalblock52.super_unique_lock._M_owns = false;
  criticalblock52.super_unique_lock._9_7_ = 0x775f05a0740;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = &criticalblock52;
  AvailableCoins((CoinsResult *)&criticalblock56,
                 (wallet *)
                 (this->super_ListCoinsTestingSetup).wallet._M_t.
                 super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
                 super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
                 super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CWallet *)0x0,
                 coinControl,(optional<CFeeRate>)(auVar3 << 0x40),in_stack_fffffffffffffc38);
  std::
  _Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
               *)&criticalblock56);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock53.super_unique_lock);
  local_230._4_4_ = (undefined4)((ulong)local_50 >> 0x20);
  criticalblock53.super_unique_lock._M_device =
       (mutex_type *)
       CONCAT71(criticalblock53.super_unique_lock._M_device._1_7_,local_208 == local_50);
  criticalblock53.super_unique_lock._M_owns = false;
  criticalblock53.super_unique_lock._9_7_ = 0;
  auStack_e0._0_8_ = (sp_counted_base *)0x0;
  local_1f0._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_1f0.m_message.px = (element_type *)0xfb26f1;
  local_200._0_8_ = &local_208;
  criticalblock56.super_unique_lock._8_4_ = criticalblock56.super_unique_lock._8_4_ & 0xffffff00;
  criticalblock56.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013d4050;
  criticalblock55.super_unique_lock._M_device = (mutex_type *)local_230;
  criticalblock52.super_unique_lock._8_8_ =
       criticalblock52.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock52.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013d4050;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock53,&local_228,1,2,REQUIRE,0xfa50e5,(size_t)&local_1f0
             ,0x27f,(_Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
                     *)&criticalblock56,
             "(MaybeCheckNotHeld(wallet->cs_wallet), [&]() -> decltype(auto) { UniqueLock criticalblock53(MaybeCheckNotHeld(wallet->cs_wallet), \"wallet->cs_wallet\", \"/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp\", 639); return AvailableCoins(*wallet).GetTotalAmount(); }())"
             ,&criticalblock52);
  boost::detail::shared_count::~shared_count((shared_count *)auStack_e0);
  local_150._M_first._M_storage._M_storage[0] = 0xff;
  local_108 = 1;
  local_100 = 100000000;
  local_f8 = 0;
  recipient.dest.
  super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ._M_u._8_8_ = in_stack_fffffffffffffc40;
  recipient.dest.
  super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ._M_u._0_8_ = in_stack_fffffffffffffc38;
  recipient.dest.
  super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ._M_u._16_8_ = in_stack_fffffffffffffc48;
  recipient.dest.
  super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ._M_u._24_8_ = in_stack_fffffffffffffc50;
  recipient.dest.
  super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ._M_u._32_8_ = in_stack_fffffffffffffc58;
  recipient.dest.
  super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ._M_u._40_8_ = in_stack_fffffffffffffc60;
  recipient.dest.
  super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ._M_u._48_8_ = in_stack_fffffffffffffc68;
  recipient.dest.
  super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ._M_u._56_8_ = in_stack_fffffffffffffc70;
  recipient.dest.
  super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ._M_u._64_8_ = in_stack_fffffffffffffc78;
  recipient.dest.
  super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ._72_8_ = in_stack_fffffffffffffc80;
  recipient.nAmount = in_stack_fffffffffffffc88;
  recipient._88_8_ = in_stack_fffffffffffffc90;
  ListCoinsTestingSetup::AddTx(&this->super_ListCoinsTestingSetup,recipient);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&local_150._M_first);
  criticalblock52.super_unique_lock._M_device =
       &(((this->super_ListCoinsTestingSetup).wallet._M_t.
          super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
          super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
          super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl)->cs_wallet).
        super_recursive_mutex;
  criticalblock52.super_unique_lock._8_8_ =
       criticalblock52.super_unique_lock._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock52.super_unique_lock);
  ListCoins((map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
             *)&criticalblock56,
            (this->super_ListCoinsTestingSetup).wallet._M_t.
            super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
            super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
            super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl);
  std::
  _Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  ::clear((_Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
           *)(auStack_e0 + 0x10));
  boost::unit_test::lazy_ostream::inst._8_8_ = &local_d0._M_impl.super__Rb_tree_header;
  local_d0._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_58;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_right = p_Stack_60;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_color =
       criticalblock56.super_unique_lock._8_4_;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_200;
  std::
  _Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
               *)&criticalblock56);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock52.super_unique_lock);
  local_2c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_2b8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x28a;
  file_03.m_begin = (iterator)&local_2c0;
  msg_03.m_end = pvVar10;
  msg_03.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2d0,
             msg_03);
  local_228.m_empty = false;
  local_228._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_218 = boost::unit_test::lazy_ostream::inst;
  local_210 = "";
  local_208 = (string *)local_d0._M_impl.super__Rb_tree_header._M_node_count;
  criticalblock53.super_unique_lock._M_device =
       (mutex_type *)
       CONCAT71(criticalblock53.super_unique_lock._M_device._1_7_,
                (string *)local_d0._M_impl.super__Rb_tree_header._M_node_count == (string *)0x1);
  local_230._0_4_ = 1;
  criticalblock53.super_unique_lock._M_owns = false;
  criticalblock53.super_unique_lock._9_7_ = 0;
  auStack_e0._0_8_ = (sp_counted_base *)0x0;
  local_1f0._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_1f0.m_message.px = (element_type *)0xfb26f1;
  local_200._0_8_ = &local_208;
  criticalblock56.super_unique_lock._8_4_ = criticalblock56.super_unique_lock._8_4_ & 0xffffff00;
  criticalblock56.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013d3cf0;
  criticalblock55.super_unique_lock._M_device = (mutex_type *)local_230;
  criticalblock52.super_unique_lock._8_8_ =
       criticalblock52.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock52.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013d3d30;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock53,&local_228,1,2,REQUIRE,0xe84389,(size_t)&local_1f0
             ,0x28a,(_Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
                     *)&criticalblock56,"1U",&criticalblock52);
  boost::detail::shared_count::~shared_count((shared_count *)auStack_e0);
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x28b;
  file_04.m_begin = (iterator)&local_2e0;
  msg_04.m_end = pvVar10;
  msg_04.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_2f0,
             msg_04);
  local_228.m_empty = false;
  local_228._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_218 = boost::unit_test::lazy_ostream::inst;
  local_210 = "";
  pvVar5 = std::
           get<2ul,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                     ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)(local_d0._M_impl.super__Rb_tree_header._M_header._M_left + 1));
  base_blob<160u>::ToString_abi_cxx11_((string *)&criticalblock53,pvVar5);
  if (criticalblock53.super_unique_lock._8_8_ == coinbaseAddress._M_string_length) {
    if (criticalblock53.super_unique_lock._8_8_ == 0) {
      bVar11 = true;
    }
    else {
      iVar4 = bcmp(criticalblock53.super_unique_lock._M_device,coinbaseAddress._M_dataplus._M_p,
                   criticalblock53.super_unique_lock._8_8_);
      bVar11 = iVar4 == 0;
    }
  }
  else {
    bVar11 = false;
  }
  local_1f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar11;
  local_1f0.m_message.px = (element_type *)0x0;
  local_1f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_200._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_200._8_8_ = "";
  criticalblock56.super_unique_lock._8_4_ = criticalblock56.super_unique_lock._8_4_ & 0xffffff00;
  criticalblock56.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013d3d70;
  local_208 = &coinbaseAddress;
  criticalblock52.super_unique_lock._8_8_ =
       criticalblock52.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock52.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013d3d70;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  criticalblock55.super_unique_lock._M_device = (mutex_type *)&criticalblock53;
  boost::test_tools::tt_detail::report_assertion
            (&local_1f0,&local_228,1,2,REQUIRE,0xfb3093,(size_t)local_200,0x28b,
             (_Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
              *)&criticalblock56,"coinbaseAddress",&criticalblock52);
  boost::detail::shared_count::~shared_count(&local_1f0.m_message.pn);
  if (criticalblock53.super_unique_lock._M_device != (mutex_type *)auStack_e0) {
    operator_delete(criticalblock53.super_unique_lock._M_device,(ulong)(auStack_e0._0_8_ + 1));
  }
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_2f8 = "";
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x28c;
  file_05.m_begin = (iterator)&local_300;
  msg_05.m_end = pvVar10;
  msg_05.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_310,
             msg_05);
  local_228.m_empty = false;
  local_228._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_218 = boost::unit_test::lazy_ostream::inst;
  local_210 = "";
  lVar7 = (long)local_d0._M_impl.super__Rb_tree_header._M_header._M_left[3]._M_right -
          (long)local_d0._M_impl.super__Rb_tree_header._M_header._M_left[3]._M_left;
  local_208 = (string *)((lVar7 >> 5) * -0x3333333333333333);
  criticalblock56.super_unique_lock._8_4_ = criticalblock56.super_unique_lock._8_4_ & 0xffffff00;
  criticalblock56.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013d3cf0;
  criticalblock53.super_unique_lock._M_device =
       (mutex_type *)CONCAT71(criticalblock53.super_unique_lock._M_device._1_7_,lVar7 == 0x140);
  criticalblock52.super_unique_lock._8_8_ =
       criticalblock52.super_unique_lock._8_8_ & 0xffffffffffffff00;
  local_230._0_4_ = 2;
  criticalblock53.super_unique_lock._M_owns = false;
  criticalblock53.super_unique_lock._9_7_ = 0;
  auStack_e0._0_8_ = (sp_counted_base *)0x0;
  criticalblock52.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013d3d30;
  local_1f0._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_1f0.m_message.px = (element_type *)0xfb26f1;
  local_200._0_8_ = &local_208;
  criticalblock55.super_unique_lock._M_device = (mutex_type *)local_230;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock53,&local_228,1,2,REQUIRE,0xfb30d4,(size_t)&local_1f0
             ,0x28c,(_Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
                     *)&criticalblock56,"2U",&criticalblock52);
  boost::detail::shared_count::~shared_count((shared_count *)auStack_e0);
  criticalblock55.super_unique_lock._M_device =
       &(((this->super_ListCoinsTestingSetup).wallet._M_t.
          super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
          super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
          super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl)->cs_wallet).
        super_recursive_mutex;
  criticalblock55.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock55.super_unique_lock);
  local_320 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_318 = "";
  local_338._8_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_338._16_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x291;
  file_06.m_begin = (iterator)&local_320;
  msg_06.m_end = pvVar10;
  msg_06.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)(local_338 + 8),
             msg_06);
  criticalblock53.super_unique_lock._8_8_ =
       criticalblock53.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock53.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013d3cb0;
  auStack_e0._0_8_ = boost::unit_test::lazy_ostream::inst;
  auStack_e0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1b0 = 1;
  uStack_1a8 = 2100000000000000;
  local_1a0 = 2100000000000000;
  uStack_198 = 0;
  local_190 = 1;
  uStack_18e = 1;
  params._35_5_ = uStack_18d;
  params.only_spendable = true;
  params.include_immature_coinbase = false;
  params.skip_locked = true;
  params.max_amount = 2100000000000000;
  params.min_amount = 1;
  params.min_sum_amount = 2100000000000000;
  params.max_count = 0;
  AvailableCoinsListUnspent
            ((CoinsResult *)&criticalblock56,
             (this->super_ListCoinsTestingSetup).wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CCoinControl *)0x0,params
            );
  local_338._0_8_ = CoinsResult::Size((CoinsResult *)&criticalblock56);
  local_208 = (string *)local_338;
  local_230 = (undefined1  [8])&local_33c;
  local_33c = 2;
  local_1f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)((pointer)local_338._0_8_ == (pointer)0x2);
  local_1f0.m_message.px = (element_type *)0x0;
  local_1f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_200._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_200._8_8_ = "";
  criticalblock52.super_unique_lock._8_8_ =
       criticalblock52.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock52.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013d3cf0;
  local_228.m_empty = false;
  local_228._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3d30;
  local_218 = boost::unit_test::lazy_ostream::inst;
  local_210 = local_230;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1f0,(lazy_ostream *)&criticalblock53,1,2,REQUIRE,0xfb322c,(size_t)local_200,
             0x291,&criticalblock52,"2U",&local_228);
  boost::detail::shared_count::~shared_count(&local_1f0.m_message.pn);
  std::
  _Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
               *)&criticalblock56);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock55.super_unique_lock);
  if ((_Rb_tree_header *)local_d0._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_d0._M_impl.super__Rb_tree_header) {
    p_Var6 = local_d0._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      p_Var2 = p_Var6[3]._M_right;
      for (p_Var8 = p_Var6[3]._M_left; p_Var8 != p_Var2; p_Var8 = p_Var8 + 5) {
        criticalblock56.super_unique_lock._M_device =
             &(((this->super_ListCoinsTestingSetup).wallet._M_t.
                super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
                super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
                super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl)->cs_wallet).
              super_recursive_mutex;
        criticalblock56.super_unique_lock._8_4_ =
             criticalblock56.super_unique_lock._8_4_ & 0xffffff00;
        std::unique_lock<std::recursive_mutex>::lock(&criticalblock56.super_unique_lock);
        CWallet::LockCoin((this->super_ListCoinsTestingSetup).wallet._M_t.
                          super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                          .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                          (COutPoint *)(p_Var8 + 1),(WalletBatch *)0x0);
        std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock56.super_unique_lock);
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != &local_d0._M_impl.super__Rb_tree_header);
  }
  criticalblock55.super_unique_lock._M_device =
       &(((this->super_ListCoinsTestingSetup).wallet._M_t.
          super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
          super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
          super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl)->cs_wallet).
        super_recursive_mutex;
  criticalblock55.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock55.super_unique_lock);
  local_350 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_348 = "";
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x29b;
  file_07.m_begin = (iterator)&local_350;
  msg_07.m_end = pvVar10;
  msg_07.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_360,
             msg_07);
  criticalblock53.super_unique_lock._8_8_ =
       criticalblock53.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock53.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013d3cb0;
  auStack_e0._0_8_ = boost::unit_test::lazy_ostream::inst;
  auStack_e0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1d8 = 1;
  uStack_1d0 = 2100000000000000;
  local_1c8 = 2100000000000000;
  uStack_1c0 = 0;
  local_1b8 = 1;
  uStack_1b6 = 1;
  params_00._35_5_ = uStack_1b5;
  params_00.only_spendable = true;
  params_00.include_immature_coinbase = false;
  params_00.skip_locked = true;
  params_00.max_amount = 2100000000000000;
  params_00.min_amount = 1;
  params_00.min_sum_amount = 2100000000000000;
  params_00.max_count = 0;
  AvailableCoinsListUnspent
            ((CoinsResult *)&criticalblock56,
             (this->super_ListCoinsTestingSetup).wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CCoinControl *)0x0,
             params_00);
  local_338._0_8_ = CoinsResult::Size((CoinsResult *)&criticalblock56);
  local_33c = 0;
  local_1f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)((pointer)local_338._0_8_ == (pointer)0x0);
  local_1f0.m_message.px = (element_type *)0x0;
  local_1f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_200._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_200._8_8_ = "";
  local_208 = (string *)local_338;
  criticalblock52.super_unique_lock._8_8_ =
       criticalblock52.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock52.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013d3cf0;
  local_230 = (undefined1  [8])&local_33c;
  local_228.m_empty = false;
  local_228._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3d30;
  local_218 = boost::unit_test::lazy_ostream::inst;
  local_210 = local_230;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1f0,(lazy_ostream *)&criticalblock53,1,2,REQUIRE,0xfb322c,(size_t)local_200,
             0x29b,&criticalblock52,"0U",&local_228);
  boost::detail::shared_count::~shared_count(&local_1f0.m_message.pn);
  std::
  _Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
               *)&criticalblock56);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock55.super_unique_lock);
  criticalblock52.super_unique_lock._M_device =
       &(((this->super_ListCoinsTestingSetup).wallet._M_t.
          super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
          super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
          super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl)->cs_wallet).
        super_recursive_mutex;
  criticalblock52.super_unique_lock._8_8_ =
       criticalblock52.super_unique_lock._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock52.super_unique_lock);
  ListCoins((map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
             *)&criticalblock56,
            (this->super_ListCoinsTestingSetup).wallet._M_t.
            super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
            super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
            super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl);
  std::
  _Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  ::clear((_Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
           *)(auStack_e0 + 0x10));
  boost::unit_test::lazy_ostream::inst._8_8_ = &local_d0._M_impl.super__Rb_tree_header;
  local_d0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_color =
       criticalblock56.super_unique_lock._8_4_;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_200;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)&criticalblock56.super_unique_lock._M_owns;
  std::
  _Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
               *)&criticalblock56);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock52.super_unique_lock);
  file_08.m_end = (iterator)0x2a3;
  file_08.m_begin = &stack0xfffffffffffffc90;
  msg_08.m_end = pvVar10;
  msg_08.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,
             (size_t)&stack0xfffffffffffffc80,msg_08);
  local_228.m_empty = false;
  local_228._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_218 = boost::unit_test::lazy_ostream::inst;
  local_210 = "";
  local_208 = (string *)local_d0._M_impl.super__Rb_tree_header._M_node_count;
  criticalblock53.super_unique_lock._M_device =
       (mutex_type *)
       CONCAT71(criticalblock53.super_unique_lock._M_device._1_7_,
                (string *)local_d0._M_impl.super__Rb_tree_header._M_node_count == (string *)0x1);
  local_230._0_4_ = 1;
  criticalblock53.super_unique_lock._M_owns = false;
  criticalblock53.super_unique_lock._9_7_ = 0;
  auStack_e0._0_8_ = (sp_counted_base *)0x0;
  local_1f0._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_1f0.m_message.px = (element_type *)0xfb26f1;
  local_200._0_8_ = &local_208;
  criticalblock56.super_unique_lock._8_4_ = criticalblock56.super_unique_lock._8_4_ & 0xffffff00;
  criticalblock56.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013d3cf0;
  criticalblock55.super_unique_lock._M_device = (mutex_type *)local_230;
  criticalblock52.super_unique_lock._8_8_ =
       criticalblock52.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock52.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013d3d30;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock53,&local_228,1,2,REQUIRE,0xe84389,(size_t)&local_1f0
             ,0x2a3,(_Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
                     *)&criticalblock56,"1U",&criticalblock52.super_unique_lock);
  boost::detail::shared_count::~shared_count((shared_count *)auStack_e0);
  file_09.m_end = (iterator)0x2a4;
  file_09.m_begin = &stack0xfffffffffffffc70;
  msg_09.m_end = pvVar10;
  msg_09.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,
             (size_t)&stack0xfffffffffffffc60,msg_09);
  local_228.m_empty = false;
  local_228._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_218 = boost::unit_test::lazy_ostream::inst;
  local_210 = "";
  pvVar5 = std::
           get<2ul,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                     ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)(local_d0._M_impl.super__Rb_tree_header._M_header._M_left + 1));
  base_blob<160u>::ToString_abi_cxx11_((string *)&criticalblock53,pvVar5);
  if (criticalblock53.super_unique_lock._8_8_ == coinbaseAddress._M_string_length) {
    if (criticalblock53.super_unique_lock._8_8_ == 0) {
      bVar11 = true;
    }
    else {
      iVar4 = bcmp(criticalblock53.super_unique_lock._M_device,coinbaseAddress._M_dataplus._M_p,
                   criticalblock53.super_unique_lock._8_8_);
      bVar11 = iVar4 == 0;
    }
  }
  else {
    bVar11 = false;
  }
  local_1f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar11;
  local_1f0.m_message.px = (element_type *)0x0;
  local_1f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_200._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_200._8_8_ = "";
  criticalblock56.super_unique_lock._8_4_ = criticalblock56.super_unique_lock._8_4_ & 0xffffff00;
  criticalblock56.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013d3d70;
  local_208 = &coinbaseAddress;
  criticalblock52.super_unique_lock._8_8_ =
       criticalblock52.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock52.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013d3d70;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  criticalblock55.super_unique_lock._M_device = (mutex_type *)&criticalblock53;
  boost::test_tools::tt_detail::report_assertion
            (&local_1f0,&local_228,1,2,REQUIRE,0xfb3093,(size_t)local_200,0x2a4,
             (_Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
              *)&criticalblock56,"coinbaseAddress",&criticalblock52.super_unique_lock);
  boost::detail::shared_count::~shared_count(&local_1f0.m_message.pn);
  if (criticalblock53.super_unique_lock._M_device != (mutex_type *)auStack_e0) {
    operator_delete(criticalblock53.super_unique_lock._M_device,(ulong)(auStack_e0._0_8_ + 1));
  }
  file_10.m_end = (iterator)0x2a5;
  file_10.m_begin = &stack0xfffffffffffffc50;
  msg_10.m_end = pvVar10;
  msg_10.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,
             (size_t)&stack0xfffffffffffffc40,msg_10);
  local_228.m_empty = false;
  local_228._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_218 = boost::unit_test::lazy_ostream::inst;
  local_210 = "";
  lVar7 = (long)local_d0._M_impl.super__Rb_tree_header._M_header._M_left[3]._M_right -
          (long)local_d0._M_impl.super__Rb_tree_header._M_header._M_left[3]._M_left;
  local_208 = (string *)((lVar7 >> 5) * -0x3333333333333333);
  criticalblock53.super_unique_lock._M_device =
       (mutex_type *)CONCAT71(criticalblock53.super_unique_lock._M_device._1_7_,lVar7 == 0x140);
  local_230._0_4_ = 2;
  criticalblock53.super_unique_lock._M_owns = false;
  criticalblock53.super_unique_lock._9_7_ = 0;
  auStack_e0._0_8_ = (sp_counted_base *)0x0;
  local_1f0._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_1f0.m_message.px = (element_type *)0xfb26f1;
  local_200._0_8_ = &local_208;
  criticalblock56.super_unique_lock._8_4_ = criticalblock56.super_unique_lock._8_4_ & 0xffffff00;
  criticalblock56.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013d3cf0;
  criticalblock55.super_unique_lock._M_device = (mutex_type *)local_230;
  criticalblock52.super_unique_lock._8_8_ =
       criticalblock52.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock52.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013d3d30;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock53,&local_228,1,2,REQUIRE,0xfb30d4,(size_t)&local_1f0
             ,0x2a5,(_Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
                     *)&criticalblock56,"2U",&criticalblock52.super_unique_lock);
  boost::detail::shared_count::~shared_count((shared_count *)auStack_e0);
  std::
  _Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
               *)(auStack_e0 + 0x10));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)coinbaseAddress._M_dataplus._M_p != &coinbaseAddress.field_2) {
    operator_delete(coinbaseAddress._M_dataplus._M_p,
                    coinbaseAddress.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_FIXTURE_TEST_CASE(ListCoinsTest, ListCoinsTestingSetup)
{
    std::string coinbaseAddress = coinbaseKey.GetPubKey().GetID().ToString();

    // Confirm ListCoins initially returns 1 coin grouped under coinbaseKey
    // address.
    std::map<CTxDestination, std::vector<COutput>> list;
    {
        LOCK(wallet->cs_wallet);
        list = ListCoins(*wallet);
    }
    BOOST_CHECK_EQUAL(list.size(), 1U);
    BOOST_CHECK_EQUAL(std::get<PKHash>(list.begin()->first).ToString(), coinbaseAddress);
    BOOST_CHECK_EQUAL(list.begin()->second.size(), 1U);

    // Check initial balance from one mature coinbase transaction.
    BOOST_CHECK_EQUAL(50 * COIN, WITH_LOCK(wallet->cs_wallet, return AvailableCoins(*wallet).GetTotalAmount()));

    // Add a transaction creating a change address, and confirm ListCoins still
    // returns the coin associated with the change address underneath the
    // coinbaseKey pubkey, even though the change address has a different
    // pubkey.
    AddTx(CRecipient{PubKeyDestination{{}}, 1 * COIN, /*subtract_fee=*/false});
    {
        LOCK(wallet->cs_wallet);
        list = ListCoins(*wallet);
    }
    BOOST_CHECK_EQUAL(list.size(), 1U);
    BOOST_CHECK_EQUAL(std::get<PKHash>(list.begin()->first).ToString(), coinbaseAddress);
    BOOST_CHECK_EQUAL(list.begin()->second.size(), 2U);

    // Lock both coins. Confirm number of available coins drops to 0.
    {
        LOCK(wallet->cs_wallet);
        BOOST_CHECK_EQUAL(AvailableCoinsListUnspent(*wallet).Size(), 2U);
    }
    for (const auto& group : list) {
        for (const auto& coin : group.second) {
            LOCK(wallet->cs_wallet);
            wallet->LockCoin(coin.outpoint);
        }
    }
    {
        LOCK(wallet->cs_wallet);
        BOOST_CHECK_EQUAL(AvailableCoinsListUnspent(*wallet).Size(), 0U);
    }
    // Confirm ListCoins still returns same result as before, despite coins
    // being locked.
    {
        LOCK(wallet->cs_wallet);
        list = ListCoins(*wallet);
    }
    BOOST_CHECK_EQUAL(list.size(), 1U);
    BOOST_CHECK_EQUAL(std::get<PKHash>(list.begin()->first).ToString(), coinbaseAddress);
    BOOST_CHECK_EQUAL(list.begin()->second.size(), 2U);
}